

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O1

void __thiscall slang::parsing::Lexer::scanLineComment(Lexer *this)

{
  char cVar1;
  char *pcVar2;
  bool bVar3;
  bool bVar4;
  int unused2;
  uint32_t unused1;
  TriviaKind local_34 [4];
  basic_string_view<char,_std::char_traits<char>_> local_30;
  
  bVar3 = tryApplyCommentHandler(this);
  if (bVar3) {
    addTrivia(this,DisabledText);
    return;
  }
  bVar3 = false;
  do {
    pcVar2 = this->sourceBuffer;
    cVar1 = *pcVar2;
    if (cVar1 < '\0') {
      bVar4 = scanUTF8Char(this,bVar3,(uint32_t *)&local_30,(int *)local_34);
      bVar3 = (bool)(bVar3 | !bVar4);
      bVar4 = true;
    }
    else {
      bVar4 = false;
      if ((cVar1 != '\r') && (cVar1 != '\n')) {
        if (cVar1 == '\0') {
          bVar4 = false;
          bVar3 = false;
          if (this->sourceEnd + -1 <= pcVar2) goto LAB_002cea4a;
          this->errorCount = this->errorCount + 1;
          Diagnostics::add(this->diagnostics,(DiagCode)0x50002,
                           (SourceLocation)
                           (((long)pcVar2 - (long)this->originalBegin) * 0x10000000 |
                           (ulong)((this->bufferId).id & 0xfffffff)));
        }
        this->sourceBuffer = this->sourceBuffer + 1;
        bVar4 = true;
        bVar3 = false;
      }
    }
LAB_002cea4a:
    if (!bVar4) {
      local_34[0] = LineComment;
      local_30._M_str = this->marker;
      local_30._M_len = (size_t)(uint)(*(int *)&this->sourceBuffer - (int)local_30._M_str);
      SmallVectorBase<slang::parsing::Trivia>::
      emplace_back<slang::parsing::TriviaKind&,std::basic_string_view<char,std::char_traits<char>>>
                (&(this->triviaBuffer).super_SmallVectorBase<slang::parsing::Trivia>,local_34,
                 &local_30);
      return;
    }
  } while( true );
}

Assistant:

void Lexer::scanLineComment() {
    if (tryApplyCommentHandler()) [[unlikely]] {
        addTrivia(TriviaKind::DisabledText);
        return;
    }

    bool sawUTF8Error = false;
    while (true) {
        char c = peek();
        if (isASCII(c)) {
            if (isNewline(c))
                break;

            sawUTF8Error = false;
            if (c == '\0') {
                if (reallyAtEnd())
                    break;

                // otherwise just error and ignore
                errorCount++;
                addDiag(diag::EmbeddedNull, currentOffset());
            }
            advance();
        }
        else {
            sawUTF8Error |= !scanUTF8Char(sawUTF8Error);
        }
    }

    addTrivia(TriviaKind::LineComment);
}